

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O1

int Abc_ObjFanoutFaninNum(Abc_Obj_t *pFanout,Abc_Obj_t *pFanin)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)(pFanout->vFanins).nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if ((Abc_Obj_t *)pFanout->pNtk->vObjs->pArray[(pFanout->vFanins).pArray[lVar2]] == pFanin) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return -1;
}

Assistant:

int Abc_ObjFanoutFaninNum( Abc_Obj_t * pFanout, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj == pFanin )
            return i;
    return -1;
}